

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec_choose.c
# Opt level: O2

void codec_choose(codec *codec,int flags)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  code *pcVar5;
  code *pcVar6;
  uint in_XCR0;
  
  if ((char)flags == '\0') {
LAB_00102cb4:
    puVar1 = (uint *)cpuid_basic_info(0);
    if (*puVar1 != 0) {
      lVar2 = cpuid_Version_info(1);
      if (((*(uint *)(lVar2 + 0xc) >> 0x1b & 1) != 0) && ((in_XCR0 & 6) != 0)) {
        if ((6 < *puVar1) &&
           (lVar3 = cpuid_Extended_Feature_Enumeration_info(7), (*(uint *)(lVar3 + 4) & 0x20) != 0))
        goto LAB_00102d36;
        if ((*(uint *)(lVar2 + 0xc) >> 0x1c & 1) != 0) {
LAB_00102d96:
          pcVar5 = base64_stream_decode_avx;
          pcVar6 = base64_stream_encode_avx;
          goto LAB_00102da4;
        }
      }
      lVar2 = cpuid_Version_info(1);
      uVar4 = *(uint *)(lVar2 + 0xc);
      if ((uVar4 >> 0x14 & 1) != 0) goto LAB_00102d56;
      if ((uVar4 >> 0x13 & 1) != 0) {
LAB_00102d76:
        pcVar5 = base64_stream_decode_sse41;
        pcVar6 = base64_stream_encode_sse41;
        goto LAB_00102da4;
      }
      if ((uVar4 >> 9 & 1) != 0) {
LAB_00102d86:
        pcVar5 = base64_stream_decode_ssse3;
        pcVar6 = base64_stream_encode_ssse3;
        goto LAB_00102da4;
      }
    }
LAB_00102d26:
    pcVar5 = base64_stream_decode_plain;
    pcVar6 = base64_stream_encode_plain;
  }
  else {
    if ((flags & 1U) != 0) {
LAB_00102d36:
      pcVar5 = base64_stream_decode_avx2;
      pcVar6 = base64_stream_encode_avx2;
      goto LAB_00102da4;
    }
    if ((flags & 2U) != 0) {
      pcVar5 = base64_stream_decode_neon32;
      pcVar6 = base64_stream_encode_neon32;
      goto LAB_00102da4;
    }
    if ((flags & 4U) != 0) {
      pcVar5 = base64_stream_decode_neon64;
      pcVar6 = base64_stream_encode_neon64;
      goto LAB_00102da4;
    }
    if ((flags & 8U) != 0) goto LAB_00102d26;
    if ((flags & 0x10U) != 0) goto LAB_00102d86;
    if ((flags & 0x20U) != 0) goto LAB_00102d76;
    if ((flags & 0x40U) == 0) {
      if (-1 < (char)flags) goto LAB_00102cb4;
      goto LAB_00102d96;
    }
LAB_00102d56:
    pcVar5 = base64_stream_decode_sse42;
    pcVar6 = base64_stream_encode_sse42;
  }
LAB_00102da4:
  codec->enc = pcVar6;
  codec->dec = pcVar5;
  return;
}

Assistant:

void
codec_choose (struct codec *codec, int flags)
{
	// User forced a codec:
	if (codec_choose_forced(codec, flags)) {
		return;
	}

	// Runtime feature detection:
	if (codec_choose_arm(codec)) {
		return;
	}
	if (codec_choose_x86(codec)) {
		return;
	}
	codec->enc = base64_stream_encode_plain;
	codec->dec = base64_stream_decode_plain;
}